

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# App.hpp
# Opt level: O0

App * __thiscall CLI::App::require_option(App *this,int value)

{
  int value_local;
  App *this_local;
  
  if (value < 0) {
    this->require_option_min_ = 0;
    this->require_option_max_ = (long)-value;
  }
  else {
    this->require_option_min_ = (long)value;
    this->require_option_max_ = (long)value;
  }
  return this;
}

Assistant:

App *require_option(int value) {
        if(value < 0) {
            require_option_min_ = 0;
            require_option_max_ = static_cast<std::size_t>(-value);
        } else {
            require_option_min_ = static_cast<std::size_t>(value);
            require_option_max_ = static_cast<std::size_t>(value);
        }
        return this;
    }